

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilCanon.c
# Opt level: O0

int Extra_TruthCanonFastN(int nVarsMax,int nVarsReal,uint *pt,uint **pptRes,char **ppfRes)

{
  int iVar1;
  int local_30;
  int RetValue;
  char **ppfRes_local;
  uint **pptRes_local;
  uint *pt_local;
  int nVarsReal_local;
  int nVarsMax_local;
  
  if (6 < nVarsMax) {
    __assert_fail("nVarsMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilCanon.c"
                  ,0x17a,
                  "int Extra_TruthCanonFastN(int, int, unsigned int *, unsigned int **, char **)");
  }
  if (nVarsMax < nVarsReal) {
    __assert_fail("nVarsReal <= nVarsMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilCanon.c"
                  ,0x17b,
                  "int Extra_TruthCanonFastN(int, int, unsigned int *, unsigned int **, char **)");
  }
  local_30 = nVarsReal;
  if (nVarsReal < 4) {
    local_30 = 3;
  }
  iVar1 = Extra_TruthCanonN_rec(local_30,(uchar *)pt,pptRes,ppfRes,0);
  if ((nVarsMax == 6) && (nVarsReal < 6)) {
    Extra_TruthCanonFastN::uTruthStore6[0] = **pptRes;
    Extra_TruthCanonFastN::uTruthStore6[1] = **pptRes;
    *pptRes = Extra_TruthCanonFastN::uTruthStore6;
  }
  return iVar1;
}

Assistant:

int Extra_TruthCanonFastN( int nVarsMax, int nVarsReal, unsigned * pt, unsigned ** pptRes, char ** ppfRes )
{
    static unsigned uTruthStore6[2];
    int RetValue;
    assert( nVarsMax <= 6 );
    assert( nVarsReal <= nVarsMax );
    RetValue = Extra_TruthCanonN_rec( nVarsReal <= 3? 3: nVarsReal, (unsigned char *)pt, pptRes, ppfRes, 0 );
    if ( nVarsMax == 6 && nVarsReal < nVarsMax )
    {
        uTruthStore6[0] = **pptRes;
        uTruthStore6[1] = **pptRes;
        *pptRes = uTruthStore6;
    }
    return RetValue;
}